

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O3

FunctionModule * __thiscall
mocker::ir::FunctionModule::operator=(FunctionModule *this,FunctionModule *param_1)

{
  size_t sVar1;
  
  std::__cxx11::string::_M_assign((string *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->args,&param_1->args);
  if (this == param_1) {
    this->isExternal = param_1->isExternal;
    sVar1 = param_1->tempRegCounter;
    this->bbsSz = param_1->bbsSz;
    this->tempRegCounter = sVar1;
  }
  else {
    std::__cxx11::list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>>::
    _M_assign_dispatch<std::_List_const_iterator<mocker::ir::BasicBlock>>
              ((list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *)&this->bbs,
               (param_1->bbs).
               super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
               _M_impl._M_node.super__List_node_base._M_next,&param_1->bbs);
    this->isExternal = param_1->isExternal;
    sVar1 = param_1->tempRegCounter;
    this->bbsSz = param_1->bbsSz;
    this->tempRegCounter = sVar1;
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::reference_wrapper<mocker::ir::BasicBlock>>,std::allocator<std::pair<unsigned_long_const,std::reference_wrapper<mocker::ir::BasicBlock>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::reference_wrapper<mocker::ir::BasicBlock>>,std::allocator<std::pair<unsigned_long_const,std::reference_wrapper<mocker::ir::BasicBlock>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::reference_wrapper<mocker::ir::BasicBlock>>,std::allocator<std::pair<unsigned_long_const,std::reference_wrapper<mocker::ir::BasicBlock>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->bbMap,&(param_1->bbMap)._M_h);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->predecessors,&(param_1->predecessors)._M_h);
  }
  return this;
}

Assistant:

FunctionModule &operator=(const FunctionModule &) = default;